

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

void __thiscall Board::moveBlock(Board *this,int index,int direction)

{
  Block block;
  Block block_00;
  reference pvVar1;
  int direction_local;
  int index_local;
  Board *this_local;
  
  pvVar1 = std::vector<Block,_std::allocator<Block>_>::operator[](&this->blocks,(long)index);
  block.id = pvVar1->id;
  block.row = pvVar1->row;
  block.column = pvVar1->column;
  block.length = pvVar1->length;
  block.direction = pvVar1->direction;
  insert(this,block,0);
  pvVar1 = std::vector<Block,_std::allocator<Block>_>::operator[](&this->blocks,(long)index);
  Block::move(pvVar1,direction);
  pvVar1 = std::vector<Block,_std::allocator<Block>_>::operator[](&this->blocks,(long)index);
  block_00.id = pvVar1->id;
  block_00.row = pvVar1->row;
  block_00.column = pvVar1->column;
  block_00.length = pvVar1->length;
  block_00.direction = pvVar1->direction;
  insert(this,block_00,-1);
  return;
}

Assistant:

void Board::moveBlock(int index, int direction) {
    // Remove the block.
    this->insert(this->blocks[index], 0);

    // Move the block.
    this->blocks[index].move(direction);

    // Insert the moved block back to the board.
    this->insert(this->blocks[index]);
}